

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

void Psr_ManBuildNtk(Bac_Ntk_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap,
                    Vec_Int_t *vBoxes)

{
  int **ppiVar1;
  Bac_ObjType_t Type;
  int *piVar2;
  Bac_Man_t *pBVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  Bac_Ntk_t *pBVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  uint i;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  Vec_Int_t *pVVar20;
  uint local_7c;
  
  if ((pNtk->vInouts).nSize != 0) {
    __assert_fail("Psr_NtkPioNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                  ,0xa2,
                  "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Psr_ManRemapBoxes(pNew->pDesign,vDes,pNtk,vMap);
  iVar4 = (pNew->vType).nCap;
  lVar12 = (long)iVar4;
  if (lVar12 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
  }
  if ((pNew->vName).nCap < iVar4) {
    piVar8 = (pNew->vName).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(lVar12 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,lVar12 * 4);
    }
    (pNew->vName).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNew->vName).nCap = iVar4;
  }
  if (0 < iVar4) {
    memset((pNew->vName).pArray,0,lVar12 << 2);
  }
  (pNew->vName).nSize = iVar4;
  if (0 < (pNtk->vInputs).nSize) {
    uVar17 = 0;
    do {
      if ((long)(pNtk->vInputs).nSize <= (long)uVar17) goto LAB_003be15e;
      uVar5 = (pNtk->vInputs).pArray[uVar17];
      uVar13 = (ulong)uVar5;
      if (uVar13 == 0) break;
      if (((int)uVar5 < 0) || (vMap->nSize <= (int)uVar5)) goto LAB_003be15e;
      if (vMap->pArray[uVar13] != 0xffffffff) {
        printf("Primary inputs %d and %d have the same name.\n",(ulong)(uint)vMap->pArray[uVar13],
               uVar17 & 0xffffffff);
      }
      iVar4 = Bac_ObjAlloc(pNew,BAC_OBJ_PI,-1);
      Bac_ObjSetName(pNew,iVar4,uVar5 * 4);
      if (vMap->nSize <= (int)uVar5) goto LAB_003be1f9;
      vMap->pArray[uVar13] = iVar4;
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)(pNtk->vInputs).nSize);
  }
  vBoxes->nSize = 0;
  if (0 < (pNtk->vObjs).nSize) {
    ppiVar1 = &vMap->pArray;
    lVar12 = 0;
    do {
      piVar8 = (pNtk->vObjs).pArray;
      iVar4 = piVar8[lVar12];
      if (((long)iVar4 < 0) || (iVar7 = (pNtk->vBoxes).nSize, iVar7 <= iVar4)) goto LAB_003be15e;
      piVar2 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar2[iVar4] + -2;
      iVar18 = piVar8[lVar12];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if (((long)iVar18 < -3) || (iVar7 <= (int)(iVar18 + 3U))) goto LAB_003be294;
      Psr_BoxSignals_V._8_8_ = piVar2 + (iVar18 + 3U);
      if (*(int *)Psr_BoxSignals_V._8_8_ == 0) {
        if ((iVar18 < -1) || (iVar18 < 0)) goto LAB_003be15e;
        Type = piVar2[iVar18 + 1U];
        iVar4 = piVar2[iVar18];
        if (5 < iVar4) {
          iVar4 = ((iVar4 - (iVar4 + -2 >> 0x1f)) + -2 >> 1) + 1;
          do {
            Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
            iVar4 = iVar4 + -1;
          } while (2 < iVar4);
        }
        uVar5 = Bac_ObjAlloc(pNew,Type,-1);
        Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
        if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) {
LAB_003be2d2:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        uVar6 = *(uint *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4);
        if ((pNtk->field_0x4 & 2) != 0) {
          if ((int)uVar6 < 0) {
LAB_003be237:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x13e,"int Abc_Lit2Att2(int)");
          }
          if ((uVar6 & 3) != 0) {
LAB_003be218:
            __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrs.h"
                          ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
          }
          uVar6 = uVar6 >> 2;
        }
        if (((int)uVar6 < 0) || (vMap->nSize <= (int)uVar6)) goto LAB_003be15e;
        uVar17 = (ulong)uVar6;
        if ((*ppiVar1)[uVar17] != -1) {
          pcVar9 = "Node output name %d is already driven.\n";
LAB_003bd928:
          printf(pcVar9,(ulong)uVar6);
        }
LAB_003bd936:
        if (((int)uVar5 < 0) || ((pNew->vType).nSize <= (int)uVar5)) {
LAB_003be17d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if (((byte)(pNew->vType).pArray[uVar5] >> 1) - 0x49 < 0xffffffbc) {
LAB_003be256:
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
        }
        Bac_ObjSetName(pNew,uVar5 + 1,uVar6 * 4);
        if (vMap->nSize <= (int)uVar6) goto LAB_003be1f9;
        (*ppiVar1)[uVar17] = uVar5 + 1;
      }
      else {
        if (iVar18 < -1) goto LAB_003be15e;
        iVar7 = piVar2[iVar18 + 1U];
        if (((long)iVar7 < 1) || (vDes->nSize < iVar7)) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = vDes->pArray[(long)iVar7 + -1];
        }
        if (pvVar14 == (void *)0x0) {
          if (5 < piVar2[iVar4]) {
            iVar4 = (int)Psr_BoxSignals_V._0_4_ / 2 + 1;
            do {
              Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
              iVar4 = iVar4 + -1;
            } while (2 < iVar4);
          }
          uVar5 = Bac_ObjAlloc(pNew,BAC_BOX_GATE,iVar7);
          Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
          if (((lVar12 < (pNtk->vObjs).nSize) && (iVar4 = (pNtk->vObjs).pArray[lVar12], -3 < iVar4))
             && (uVar6 = iVar4 + 2, (int)uVar6 < (pNtk->vBoxes).nSize)) {
            Bac_ObjSetName(pNew,uVar5,(pNtk->vBoxes).pArray[uVar6] << 2);
            if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) goto LAB_003be2d2;
            uVar6 = *(uint *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4);
            if ((pNtk->field_0x4 & 2) != 0) {
              if ((int)uVar6 < 0) goto LAB_003be237;
              if ((uVar6 & 3) != 0) goto LAB_003be218;
              uVar6 = uVar6 >> 2;
            }
            if ((-1 < (int)uVar6) && ((int)uVar6 < vMap->nSize)) {
              uVar17 = (ulong)uVar6;
              if ((*ppiVar1)[uVar17] != -1) {
                pcVar9 = "Box output name %d is already driven.\n";
                goto LAB_003bd928;
              }
              goto LAB_003bd936;
            }
          }
          goto LAB_003be15e;
        }
        iVar4 = *(int *)((long)pvVar14 + 0x44);
        if (0 < *(int *)((long)pvVar14 + 0x34)) {
          iVar18 = *(int *)((long)pvVar14 + 0x34) + 1;
          do {
            Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
            iVar18 = iVar18 + -1;
          } while (1 < iVar18);
        }
        uVar5 = Bac_ObjAlloc(pNew,BAC_OBJ_BOX,iVar7);
        if (0 < iVar4) {
          do {
            Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        if ((((((pNtk->vObjs).nSize <= lVar12) || (iVar4 = (pNtk->vObjs).pArray[lVar12], iVar4 < -2)
              ) || (uVar6 = iVar4 + 2, (pNtk->vBoxes).nSize <= (int)uVar6)) ||
            ((Bac_ObjSetName(pNew,uVar5,(pNtk->vBoxes).pArray[uVar6] << 2),
             (pNtk->vObjs).nSize <= lVar12 || (iVar4 = (pNtk->vObjs).pArray[lVar12], iVar4 < -1))))
           || (uVar6 = iVar4 + 1, (pNtk->vBoxes).nSize <= (int)uVar6)) goto LAB_003be15e;
        pBVar3 = pNew->pDesign;
        iVar4 = (pNtk->vBoxes).pArray[uVar6];
        if (((long)iVar4 < 1) || (pBVar3->nNtks < iVar4)) {
          pBVar11 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar11 = pBVar3->pNtks + iVar4;
        }
        iVar4 = (int)((ulong)((long)pNew - (long)pBVar3->pNtks) >> 4) * -0x3b13b13b;
        if ((iVar4 < 1) || (pBVar3->nNtks < iVar4)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (pBVar11->iBoxNtk != -1) {
          __assert_fail("p->iBoxNtk == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
        }
        pBVar11->iBoxNtk = iVar4;
        pBVar11->iBoxObj = uVar5;
        if (0 < (int)Psr_BoxSignals_V._4_4_) {
          lVar15 = 1;
          do {
            iVar4 = *(int *)(Psr_BoxSignals_V._8_8_ + -4 + lVar15 * 4);
            if (*(int *)((long)pvVar14 + 0x34) < iVar4) {
              iVar4 = iVar4 + -1;
              if (*(int *)((long)pvVar14 + 0x44) <= iVar4 - *(int *)((long)pvVar14 + 0x34)) {
                __assert_fail("Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                              ,0xcb,
                              "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              if ((int)Psr_BoxSignals_V._4_4_ <= lVar15) goto LAB_003be15e;
              uVar6 = *(uint *)(Psr_BoxSignals_V._8_8_ + lVar15 * 4);
              if ((pNtk->field_0x4 & 2) != 0) {
                if ((int)uVar6 < 0) goto LAB_003be237;
                if ((uVar6 & 3) != 0) goto LAB_003be218;
                uVar6 = uVar6 >> 2;
              }
              uVar17 = (ulong)uVar6;
              if (((int)uVar6 < 0) || (vMap->nSize <= (int)uVar6)) goto LAB_003be15e;
              if (vMap->pArray[uVar17] != -1) {
                printf("Box output name %d is already driven.\n",uVar17);
              }
              if (((int)uVar5 < 0) || ((pNew->vType).nSize <= (int)uVar5)) goto LAB_003be17d;
              if (((byte)(pNew->vType).pArray[uVar5] >> 1) - 0x49 < 0xffffffbc) goto LAB_003be256;
              iVar4 = (iVar4 - *(int *)((long)pvVar14 + 0x34)) + uVar5 + 1;
              Bac_ObjSetName(pNew,iVar4,uVar6 * 4);
              if (vMap->nSize <= (int)uVar6) goto LAB_003be1f9;
              vMap->pArray[uVar17] = iVar4;
            }
            iVar4 = (int)lVar15;
            lVar15 = lVar15 + 2;
          } while (iVar4 + 1 < (int)Psr_BoxSignals_V._4_4_);
        }
      }
      Vec_IntPush(vBoxes,uVar5);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pNtk->vObjs).nSize);
  }
  if ((pNtk->vObjs).nSize < 1) {
    local_7c = 0;
    uVar5 = 0xffffffff;
  }
  else {
    pVVar20 = &pNew->vFanin;
    uVar5 = 0xffffffff;
    lVar12 = 0;
    local_7c = 0;
    do {
      piVar8 = (pNtk->vObjs).pArray;
      iVar4 = piVar8[lVar12];
      if (((long)iVar4 < 0) || (iVar7 = (pNtk->vBoxes).nSize, iVar7 <= iVar4)) goto LAB_003be15e;
      piVar2 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar2[iVar4] - 2;
      iVar4 = piVar8[lVar12];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((iVar4 < -3) || (iVar7 <= (int)(iVar4 + 3U))) {
LAB_003be294:
        Psr_BoxSignals_V._0_4_ = Psr_BoxSignals_V._4_4_;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Psr_BoxSignals_V._8_8_ = piVar2 + (iVar4 + 3U);
      if (*(int *)Psr_BoxSignals_V._8_8_ == 0) {
        if (vBoxes->nSize <= lVar12) goto LAB_003be15e;
        uVar17 = (ulong)(uint)Psr_BoxSignals_V._0_4_;
        if (2 < (int)Psr_BoxSignals_V._0_4_) {
          uVar6 = vBoxes->pArray[lVar12];
          lVar16 = (long)(int)uVar6;
          lVar15 = 0;
          do {
            lVar16 = lVar16 + -1;
            if (((int)uVar17 <= lVar15) || ((long)(int)uVar17 <= lVar15 + 1)) goto LAB_003be15e;
            uVar19 = *(uint *)(Psr_BoxSignals_V._8_8_ + 4 + lVar15 * 4);
            if ((pNtk->field_0x4 & 2) != 0) {
              if ((int)uVar19 < 0) goto LAB_003be237;
              if ((uVar19 & 3) != 0) goto LAB_003be218;
              uVar19 = uVar19 >> 2;
            }
            if (((int)uVar6 < 0) || ((pNew->vType).nSize <= (int)uVar6)) goto LAB_003be17d;
            if (((byte)(pNew->vType).pArray[uVar6] >> 1) - 0x49 < 0xffffffbc) goto LAB_003be1bb;
            if (((int)uVar19 < 0) || (vMap->nSize <= (int)uVar19)) goto LAB_003be15e;
            if (vMap->pArray[uVar19] == -1) {
              iVar4 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
              Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
              if (vMap->nSize <= (int)uVar19) goto LAB_003be1f9;
              vMap->pArray[uVar19] = iVar4 + 1;
              if (uVar5 == 0xffffffff) {
                uVar5 = uVar19;
              }
              local_7c = local_7c + 1;
            }
            if (vMap->nSize <= (int)uVar19) goto LAB_003be15e;
            if ((lVar16 < 0) || ((pNew->vType).nSize <= lVar16)) goto LAB_003be17d;
            if (((pNew->vType).pArray[lVar16] & 0xfcU) != 4) goto LAB_003be1da;
            if ((pNew->vFanin).nSize <= lVar16) goto LAB_003be15e;
            if ((pNew->vFanin).pArray[lVar16] != -1) goto LAB_003be19c;
            Vec_IntSetEntry(pVVar20,(int)lVar16,vMap->pArray[uVar19]);
            uVar17 = (ulong)(int)Psr_BoxSignals_V._4_4_;
            lVar15 = lVar15 + 2;
          } while (lVar15 < (long)(uVar17 - 2));
        }
      }
      else {
        if ((iVar4 < -1) || (iVar7 <= (int)(iVar4 + 1U))) goto LAB_003be15e;
        iVar4 = piVar2[iVar4 + 1U];
        if (((long)iVar4 < 1) || (vDes->nSize < iVar4)) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = vDes->pArray[(long)iVar4 + -1];
        }
        if (vBoxes->nSize <= lVar12) goto LAB_003be15e;
        uVar6 = vBoxes->pArray[lVar12];
        uVar17 = (ulong)(uint)Psr_BoxSignals_V._0_4_;
        if (pvVar14 == (void *)0x0) {
          if (2 < (int)Psr_BoxSignals_V._0_4_) {
            lVar16 = (long)(int)uVar6;
            lVar15 = 0;
            do {
              lVar16 = lVar16 + -1;
              if (((int)uVar17 <= lVar15) || ((long)(int)uVar17 <= lVar15 + 1)) goto LAB_003be15e;
              uVar19 = *(uint *)(Psr_BoxSignals_V._8_8_ + 4 + lVar15 * 4);
              if ((pNtk->field_0x4 & 2) != 0) {
                if ((int)uVar19 < 0) goto LAB_003be237;
                if ((uVar19 & 3) != 0) goto LAB_003be218;
                uVar19 = uVar19 >> 2;
              }
              if (((int)uVar6 < 0) || ((pNew->vType).nSize <= (int)uVar6)) goto LAB_003be17d;
              if (((byte)(pNew->vType).pArray[uVar6] >> 1) - 0x49 < 0xffffffbc) goto LAB_003be1bb;
              if (((int)uVar19 < 0) || (vMap->nSize <= (int)uVar19)) goto LAB_003be15e;
              if (vMap->pArray[uVar19] == -1) {
                iVar4 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
                Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
                if (vMap->nSize <= (int)uVar19) goto LAB_003be1f9;
                vMap->pArray[uVar19] = iVar4 + 1;
                if (uVar5 == 0xffffffff) {
                  uVar5 = uVar19;
                }
                local_7c = local_7c + 1;
              }
              if (vMap->nSize <= (int)uVar19) goto LAB_003be15e;
              if ((lVar16 < 0) || ((pNew->vType).nSize <= lVar16)) goto LAB_003be17d;
              if (((pNew->vType).pArray[lVar16] & 0xfcU) != 4) goto LAB_003be1da;
              if ((pNew->vFanin).nSize <= lVar16) goto LAB_003be15e;
              if ((pNew->vFanin).pArray[lVar16] != -1) goto LAB_003be19c;
              Vec_IntSetEntry(pVVar20,(int)lVar16,vMap->pArray[uVar19]);
              uVar17 = (ulong)(int)Psr_BoxSignals_V._4_4_;
              lVar15 = lVar15 + 2;
            } while (lVar15 < (long)(uVar17 - 2));
          }
        }
        else if (0 < (int)Psr_BoxSignals_V._0_4_) {
          lVar15 = 1;
          do {
            iVar4 = *(int *)(Psr_BoxSignals_V._8_8_ + -4 + lVar15 * 4);
            if (iVar4 <= *(int *)((long)pvVar14 + 0x34)) {
              if ((int)uVar17 <= lVar15) goto LAB_003be15e;
              uVar19 = *(uint *)(Psr_BoxSignals_V._8_8_ + lVar15 * 4);
              if ((pNtk->field_0x4 & 2) != 0) {
                if ((int)uVar19 < 0) goto LAB_003be237;
                if ((uVar19 & 3) != 0) goto LAB_003be218;
                uVar19 = uVar19 >> 2;
              }
              if (((int)uVar6 < 0) || ((pNew->vType).nSize <= (int)uVar6)) goto LAB_003be17d;
              if (((byte)(pNew->vType).pArray[uVar6] >> 1) - 0x49 < 0xffffffbc) {
LAB_003be1bb:
                __assert_fail("Bac_ObjIsBox(p, b)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                              ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
              }
              if (((int)uVar19 < 0) || (vMap->nSize <= (int)uVar19)) goto LAB_003be15e;
              if (vMap->pArray[uVar19] == -1) {
                iVar7 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
                Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
                if (vMap->nSize <= (int)uVar19) goto LAB_003be1f9;
                vMap->pArray[uVar19] = iVar7 + 1;
                if (uVar5 == 0xffffffff) {
                  uVar5 = uVar19;
                }
                local_7c = local_7c + 1;
              }
              if (vMap->nSize <= (int)uVar19) goto LAB_003be15e;
              i = uVar6 - iVar4;
              if (((int)i < 0) || ((pNew->vType).nSize <= (int)i)) goto LAB_003be17d;
              if (((pNew->vType).pArray[i] & 0xfcU) != 4) {
LAB_003be1da:
                __assert_fail("Bac_ObjIsCo(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                              ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
              }
              if ((pNew->vFanin).nSize <= (int)i) goto LAB_003be15e;
              if ((pNew->vFanin).pArray[i] != -1) {
LAB_003be19c:
                __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                              ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
              }
              Vec_IntSetEntry(pVVar20,i,vMap->pArray[uVar19]);
            }
            uVar17 = (ulong)(uint)Psr_BoxSignals_V._4_4_;
            iVar4 = (int)lVar15;
            lVar15 = lVar15 + 2;
          } while (iVar4 + 1 < (int)Psr_BoxSignals_V._4_4_);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pNtk->vObjs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar12 = 0;
    do {
      if ((pNtk->vOutputs).nSize <= lVar12) goto LAB_003be15e;
      uVar6 = (pNtk->vOutputs).pArray[lVar12];
      uVar17 = (ulong)uVar6;
      if (uVar17 == 0) break;
      if (((int)uVar6 < 0) || (vMap->nSize <= (int)uVar6)) goto LAB_003be15e;
      if (vMap->pArray[uVar17] == -1) {
        iVar4 = Bac_ObjAlloc(pNew,BAC_BOX_CF,-1);
        Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
        if (vMap->nSize <= (int)uVar6) {
LAB_003be1f9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar17] = iVar4 + 1;
        if (uVar5 != 0xffffffff) {
          uVar6 = uVar5;
        }
        local_7c = local_7c + 1;
        uVar5 = uVar6;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pNtk->vOutputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar12 = 0;
LAB_003be077:
    if ((pNtk->vOutputs).nSize <= lVar12) {
LAB_003be15e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar6 = (pNtk->vOutputs).pArray[lVar12];
    if ((ulong)uVar6 != 0) {
      if (((int)uVar6 < 0) || (vMap->nSize <= (int)uVar6)) goto LAB_003be15e;
      Bac_ObjAlloc(pNew,BAC_OBJ_PO,vMap->pArray[uVar6]);
      lVar12 = lVar12 + 1;
      if (lVar12 < (pNtk->vOutputs).nSize) goto LAB_003be077;
    }
  }
  if (local_7c != 0) {
    pcVar9 = Abc_NamStr(pNtk->pStrs,pNtk->iModuleName);
    pcVar10 = Abc_NamStr(pNtk->pStrs,uVar5);
    printf("Module %s has %d non-driven nets (for example, %s).\n",pcVar9,(ulong)local_7c,pcVar10);
  }
  Psr_ManCleanMap(pNtk,vMap);
  if (0 < (pNtk->vOrder).nSize) {
    pVVar20 = &pNew->vInfo;
    lVar12 = 0;
    do {
      Vec_IntPush(pVVar20,(pNtk->vOrder).pArray[lVar12]);
      Vec_IntPush(pVVar20,-1);
      Vec_IntPush(pVVar20,-1);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pNtk->vOrder).nSize);
  }
  return;
}

Assistant:

void Psr_ManBuildNtk( Bac_Ntk_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap, Vec_Int_t * vBoxes )
{
    Psr_Ntk_t * pNtkBox; Vec_Int_t * vSigs; int iBox;
    int i, Index, NameId, iObj, iConst0, iTerm;
    int iNonDriven = -1, nNonDriven = 0;
    assert( Psr_NtkPioNum(pNtk) == 0 );
    Psr_ManRemapBoxes( pNew->pDesign, vDes, pNtk, vMap );
    Bac_NtkStartNames( pNew );
    // create primary inputs 
    Psr_NtkForEachPi( pNtk, NameId, i )
    {
        if ( Vec_IntEntry(vMap, NameId) != -1 )
            printf( "Primary inputs %d and %d have the same name.\n", Vec_IntEntry(vMap, NameId), i );
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntWriteEntry( vMap, NameId, iObj );
    }
    // create box outputs
    Vec_IntClear( vBoxes );
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            if ( pNtkBox == NULL )
            {
                iObj = Bac_BoxAlloc( pNew, BAC_BOX_GATE, Vec_IntSize(vSigs)/2-1, 1, Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                // consider box output 
                NameId = Vec_IntEntryLast( vSigs );
                NameId = Psr_NtkSigName( pNtk, NameId );
                if ( Vec_IntEntry(vMap, NameId) != -1 )
                    printf( "Box output name %d is already driven.\n", NameId );
                iTerm = Bac_BoxBo( pNew, iObj, 0 );
                Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                Vec_IntWriteEntry( vMap, NameId, iTerm );
            }
            else
            {
                iObj = Bac_BoxAlloc( pNew, BAC_OBJ_BOX, Psr_NtkPiNum(pNtkBox), Psr_NtkPoNum(pNtkBox), Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                Bac_NtkSetHost( Bac_ManNtk(pNew->pDesign, Psr_BoxNtk(pNtk, iBox)), Bac_NtkId(pNew), iObj );
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index < Psr_NtkPiNum(pNtkBox) )
                        continue;
                    assert( Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox) );
                    // consider box output 
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    if ( Vec_IntEntry(vMap, NameId) != -1 )
                        printf( "Box output name %d is already driven.\n", NameId );
                    iTerm = Bac_BoxBo( pNew, iObj, Index - Psr_NtkPiNum(pNtkBox) );
                    Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                    Vec_IntWriteEntry( vMap, NameId, iTerm );
                }
            }
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
        else
        {
            iObj = Bac_BoxAlloc( pNew, (Bac_ObjType_t)Psr_BoxNtk(pNtk, iBox), Psr_BoxIONum(pNtk, iBox)-1, 1, -1 );
            // consider box output 
            NameId = Vec_IntEntryLast( vSigs );
            NameId = Psr_NtkSigName( pNtk, NameId );
            if ( Vec_IntEntry(vMap, NameId) != -1 )
                printf( "Node output name %d is already driven.\n", NameId );
            iTerm = Bac_BoxBo( pNew, iObj, 0 );
            Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntWriteEntry( vMap, NameId, iTerm );
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
    // add fanins for box inputs
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            iObj = Vec_IntEntry( vBoxes, iBox );
            if ( pNtkBox == NULL )
            {
                Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
                {
                    i++;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
            else
            {
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index >= Psr_NtkPiNum(pNtkBox) )
                        continue;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, Index );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
        }
        else
        {
            iObj = Vec_IntEntry( vBoxes, iBox );
            Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
            {
                NameId = Vec_IntEntry( vSigs, ++i );
                NameId = Psr_NtkSigName( pNtk, NameId );
                iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                if ( Vec_IntEntry(vMap, NameId) == -1 )
                {
                    iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                    Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                    if ( iNonDriven == -1 )
                        iNonDriven = NameId;
                    nNonDriven++;
                }
                Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
            }
        }
    // add fanins for primary outputs
    Psr_NtkForEachPo( pNtk, NameId, i )
        if ( Vec_IntEntry(vMap, NameId) == -1 )
        {
            iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
            Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
            if ( iNonDriven == -1 )
                iNonDriven = NameId;
            nNonDriven++;
        }
    Psr_NtkForEachPo( pNtk, NameId, i )
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PO, Vec_IntEntry(vMap, NameId) );
    if ( nNonDriven )
        printf( "Module %s has %d non-driven nets (for example, %s).\n", Psr_NtkName(pNtk), nNonDriven, Psr_NtkStr(pNtk, iNonDriven) );
    Psr_ManCleanMap( pNtk, vMap );
    // setup info
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
        Bac_NtkAddInfo( pNew, NameId, -1, -1 );
}